

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 extraout_RAX;
  void *in_RCX;
  CapTableBuilder *in_RDX;
  ulong in_R8;
  CapTableBuilder *unaff_R14;
  AllocateResult AVar1;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  if (in_R8 < 0x20000000) {
    unaff_R14 = in_RDX;
    if (src != (EVP_PKEY_CTX *)0x0) {
      AVar1 = BuilderArena::allocate((BuilderArena *)src,(int)in_R8 + 7U >> 3);
      *(undefined4 *)dst = 0xfffffffd;
      *(int *)(dst + 4) = (int)in_R8 * 8 + 2;
      if (in_R8 != 0) {
        memcpy(AVar1.words,in_RCX,in_R8);
      }
      *(SegmentBuilder **)(dst + 8) = AVar1.segment;
      *(CapTableBuilder **)(dst + 0x10) = in_RDX;
      *(word **)(dst + 0x18) = AVar1.words;
      return (int)dst;
    }
  }
  else {
    anon_func::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)dst);
  }
  WireHelpers::zeroObject((SegmentBuilder *)0x0,unaff_R14,(WirePointer *)dst);
  if (*(long *)(dst + 8) != 0) {
    euthanize((OrphanBuilder *)dst);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Data::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setDataPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}